

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O3

void bsc_group_destroy(bsc_group_t group)

{
  *(undefined4 *)group = 0;
  free(*(void **)((long)group + 8));
  free(*(void **)((long)group + 0x18));
  free(*(void **)((long)group + 0x10));
  free(group);
  return;
}

Assistant:

void bsc_group_destroy( bsc_group_t group )
{
    group_t * g = group;
    group_destroy( g );
    free( g );
}